

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O1

any * __thiscall hwnet::any::operator=(any *this,any *rhs)

{
  int *piVar1;
  
  if (rhs != this) {
    _destroy(this);
    piVar1 = rhs->counter;
    if ((piVar1 == (int *)0x0) || (rhs->content == (placeholder *)0x0)) {
      this->content = (placeholder *)0x0;
    }
    else {
      this->content = rhs->content;
      this->counter = piVar1;
      *piVar1 = *piVar1 + 1;
    }
  }
  return this;
}

Assistant:

any & operator=(const any & rhs)
	{
		if(&rhs == this)
			return *this;
		else
		{      
			_destroy();
			if(rhs.counter && rhs.content)
			{
				content = rhs.content;
				counter = rhs.counter;
				++(*counter);
			}
			else
			{
				content = nullptr;
			}
			return *this;
		}
	}